

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.h
# Opt level: O3

void __thiscall Server<Client>::start(Server<Client> *this)

{
  anon_class_16_2_37edc3c6_for__M_fn *in_RCX;
  sockaddr *in_RDX;
  sockaddr *extraout_RDX;
  Client cl;
  undefined1 local_79;
  anon_class_16_2_37edc3c6_for__M_fn local_78;
  impl_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  impl_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  
  LOCK();
  (this->is_working)._M_base._M_i = true;
  UNLOCK();
  if (((this->is_working)._M_base._M_i & 1U) != 0) {
    do {
      Acceptor<Client>::accept
                ((Acceptor<Client> *)&stack0xffffffffffffffb0,(int)this + 8,in_RDX,
                 (socklen_t *)in_RCX);
      local_78.this = this;
      Client::Client(&local_78.client,(Client *)&stack0xffffffffffffffb0);
      local_68 = (impl_type *)0x0;
      in_RCX = &local_78;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::__future_base::_Task_state<Server<Client>::start()::_lambda()_1_,std::allocator<int>,void()>,std::allocator<int>,Server<Client>::start()::_lambda()_1_,std::allocator<int>const&>
                (a_Stack_60,
                 (_Task_state<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_AleksMVP[P]mitm_proxy_include_Server_h:44:13),_std::allocator<int>,_void_()>
                  **)&local_68,(allocator<int> *)&local_79,in_RCX,(allocator<int> *)&local_79);
      local_48 = local_68;
      _Stack_40._M_pi = a_Stack_60[0]._M_pi;
      Client::~Client(&local_78.client);
      NotLockFreeQueue<std::packaged_task<void_()>_>::push_and_wait
                (&(this->thread_pool).queue,(packaged_task<void_()> *)&stack0xffffffffffffffb8);
      std::packaged_task<void_()>::~packaged_task
                ((packaged_task<void_()> *)&stack0xffffffffffffffb8);
      Client::~Client((Client *)&stack0xffffffffffffffb0);
      in_RDX = extraout_RDX;
    } while (((this->is_working)._M_base._M_i & 1U) != 0);
  }
  return;
}

Assistant:

void Server<T>::start() {
    is_working = true;
    while(is_working) {
        T cl(acceptor.accept());
        std::packaged_task<void(void)> task(
            [this, client = std::move(cl)] () mutable {
                handler.handle(std::move(client));
            }
        );
        thread_pool.push(std::move(task));
    }
}